

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

ParamType *
testing::
WithParamInterface<std::tuple<(anonymous_namespace)::TextureSet,_(anonymous_namespace)::FormatFeature>_>
::GetParam(void)

{
  bool bVar1;
  ostream *poVar2;
  int in_stack_0000003c;
  char *in_stack_00000040;
  GTestLogSeverity in_stack_0000004c;
  GTestLog *in_stack_00000050;
  GTestLog local_4;
  
  bVar1 = internal::IsTrue(WithParamInterface<std::tuple<(anonymous_namespace)::TextureSet,(anonymous_namespace)::FormatFeature>>
                           ::parameter_ != (ParamType *)0x0);
  if (!bVar1) {
    internal::GTestLog::GTestLog
              (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    poVar2 = internal::GTestLog::GetStream(&local_4);
    poVar2 = std::operator<<(poVar2,"Condition parameter_ != nullptr failed. ");
    poVar2 = std::operator<<(poVar2,
                             "GetParam() can only be called inside a value-parameterized test ");
    std::operator<<(poVar2,"-- did you intend to write TEST_P instead of TEST_F?");
    internal::GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  return WithParamInterface<std::tuple<(anonymous_namespace)::TextureSet,(anonymous_namespace)::FormatFeature>>
         ::parameter_;
}

Assistant:

static const ParamType& GetParam() {
    GTEST_CHECK_(parameter_ != nullptr)
        << "GetParam() can only be called inside a value-parameterized test "
        << "-- did you intend to write TEST_P instead of TEST_F?";
    return *parameter_;
  }